

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_hdr_parse_sample_line(bcf_hdr_t *h,char *str)

{
  int iVar1;
  char *__dest;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = str + 1;
  iVar2 = 0;
  iVar3 = 0;
  pcVar4 = str;
  do {
    if (((byte)pcVar5[-1] < 0xb) && ((0x601U >> ((byte)pcVar5[-1] & 0x1f) & 1) != 0)) {
      if (8 < iVar2) {
        __dest = (char *)malloc(((long)pcVar4 - (long)str) + 1);
        strncpy(__dest,str,(long)pcVar4 - (long)str);
        pcVar4[(long)__dest - (long)str] = '\0';
        iVar1 = bcf_hdr_add_sample(h,__dest);
        if (iVar1 < 0) {
          iVar3 = -1;
        }
        free(__dest);
      }
      if ((pcVar5[-1] == '\0') || (pcVar5[-1] == '\n')) {
        return iVar3;
      }
      iVar2 = iVar2 + 1;
      str = pcVar5;
    }
    pcVar5 = pcVar5 + 1;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

int bcf_hdr_parse_sample_line(bcf_hdr_t *h, const char *str)
{
    int ret = 0;
    int i = 0;
    const char *p, *q;
    // add samples
    for (p = q = str;; ++q) {
        if (*q != '\t' && *q != 0 && *q != '\n') continue;
        if (++i > 9) {
            char *s = (char*)malloc(q - p + 1);
            strncpy(s, p, q - p);
            s[q - p] = 0;
            if ( bcf_hdr_add_sample(h,s) < 0 ) ret = -1;
            free(s);
        }
        if (*q == 0 || *q == '\n') break;
        p = q + 1;
    }
    bcf_hdr_add_sample(h,NULL);
    return ret;
}